

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

MatrixXd * __thiscall
lf::uscalfe::FeLagrangeO3Tria<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeLagrangeO3Tria<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<double,_2,_10,_0,_2,_10>_> *this_00;
  long lVar6;
  Index index;
  ulong uVar7;
  ActualDstType actualDst;
  long lVar8;
  Matrix<double,_2,_1,_0,_2,_1> center;
  Matrix<double,_2,_3,_0,_2,_3> vertices;
  Matrix<double,_2,_10,_0,_2,_10> nodes;
  Matrix<double,_2,_6,_0,_2,_6> edges;
  CommaInitializer<Eigen::Matrix<double,_2,_10,_0,_2,_10>_> local_1d0;
  undefined1 *local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  Scalar local_198;
  Scalar local_190;
  undefined1 local_188 [64];
  undefined1 local_148 [56];
  double adStack_110 [19];
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_1d0.m_xpr = (Matrix<double,_2,_10,_0,_2,_10> *)local_148;
  local_1d0.m_row = 0;
  local_1d0.m_col = 1;
  local_1d0.m_currentBlockRows = 1;
  local_148._0_8_ = 0.0;
  local_1b0 = (undefined1 *)0x3ff0000000000000;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)&local_1d0,
                      (Scalar *)&local_1b0);
  local_190 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_
                     (pCVar4,&local_190);
  local_198 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_
                     (pCVar4,&local_198);
  local_1a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_
                     (pCVar4,&local_1a0);
  local_1a8 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_(pCVar4,&local_1a8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)&local_1d0);
  local_1d0.m_xpr = (Matrix<double,_2,_10,_0,_2,_10> *)&stack0xffffffffffffff88;
  local_1d0.m_row = 0;
  local_1d0.m_col = 1;
  local_1d0.m_currentBlockRows = 1;
  local_78 = 1.0;
  local_1b0 = (undefined1 *)0x4000000000000000;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *)&local_1d0,
                      (Scalar *)&local_1b0);
  local_190 = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,&local_190);
  local_198 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,&local_198);
  local_1a0 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,&local_1a0);
  local_1a8 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,&local_1a8);
  local_188._56_8_ = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,(Scalar *)(local_188 + 0x38));
  local_188._48_8_ = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,(Scalar *)(local_188 + 0x30));
  local_188._40_8_ = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,(Scalar *)(local_188 + 0x28));
  local_188._32_8_ = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,(Scalar *)(local_188 + 0x20));
  local_188._24_8_ = 2.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar5,(Scalar *)(local_188 + 0x18));
  local_188._16_8_ = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
            (pCVar5,(Scalar *)(local_188 + 0x10));
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *)&local_1d0);
  local_1d0.m_xpr = (Matrix<double,_2,_10,_0,_2,_10> *)local_188;
  local_1d0.m_row = 0;
  local_1d0.m_col = 1;
  local_1d0.m_currentBlockRows = 1;
  local_188._0_8_ = &DAT_3fd5555555555555;
  local_1b0 = &DAT_3fd5555555555555;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_1d0,
             (Scalar *)&local_1b0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_1d0);
  local_78 = local_78 * 0.3333333333333333;
  dStack_70 = dStack_70 * 0.3333333333333333;
  local_68 = local_68 * 0.3333333333333333;
  dStack_60 = dStack_60 * 0.3333333333333333;
  local_58 = local_58 * 0.3333333333333333;
  dStack_50 = dStack_50 * 0.3333333333333333;
  local_48 = local_48 * 0.3333333333333333;
  dStack_40 = dStack_40 * 0.3333333333333333;
  local_38 = local_38 * 0.3333333333333333;
  dStack_30 = dStack_30 * 0.3333333333333333;
  local_28 = local_28 * 0.3333333333333333;
  dStack_20 = dStack_20 * 0.3333333333333333;
  Eigen::CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>>::
  CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>
            ((CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>> *)&local_1d0,
             (Matrix<double,_2,_10,_0,_2,_10> *)(local_148 + 0x30),
             (DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_148);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>> *)&local_1d0,
                       (DenseBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *)&stack0xffffffffffffff88)
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>> *)this_00,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_188);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_10,_0,_2,_10>_>::finished(&local_1d0);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0x14,2,10);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,2,10,0,2,10>,double,double>
            (__return_storage_ptr__,(Matrix<double,_2,_10,_0,_2,_10> *)(local_148 + 0x30),
             (assign_op<double,_double> *)&local_1d0);
  pdVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  lVar6 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols *
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  uVar7 = lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar6) {
    lVar8 = 0;
    do {
      dVar3 = adStack_110[lVar8];
      pdVar1 = pdVar2 + lVar8;
      *pdVar1 = adStack_110[lVar8 + -1];
      pdVar1[1] = dVar3;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar7);
  }
  if ((long)uVar7 < lVar6) {
    do {
      pdVar2[uVar7] = adStack_110[uVar7 - 1];
      uVar7 = uVar7 + 1;
    } while (lVar6 - uVar7 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    Eigen::Matrix<double, 2, 10> nodes;
    Eigen::Matrix<double, 2, 3> vertices;
    Eigen::Matrix<double, 2, 6> edges;
    Eigen::Matrix<double, 2, 1> center;

    // clang-format off
    vertices << 0.0, 1.0, 0.0,
                0.0, 0.0, 1.0;
    edges << 1.0, 2.0, 2.0, 1.0, 0.0, 0.0,
             0.0, 0.0, 1.0, 2.0, 2.0, 1.0;
    center << 1.0 / 3.0,
              1.0 / 3.0;
    // clang-format on
    edges *= 1.0 / 3.0;
    nodes << vertices, edges, center;

    return nodes;
  }